

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O0

void delDirOrFile(int id,int parentid)

{
  int iVar1;
  File_Block *__s;
  dir_block *__s_00;
  inode *q_1;
  int i;
  dir_block *p_1;
  inode *q;
  File_Block *p;
  int local_10;
  int size;
  int parentid_local;
  int id_local;
  
  if (inodes[id].i_mode == 2) {
    iVar1 = inodes[id].i_file_size;
    inodes[parentid].i_file_size = inodes[parentid].i_file_size - iVar1;
    local_10 = parentid;
    while (local_10 != 0) {
      local_10 = getParentById(local_10);
      inodes[local_10].i_file_size = inodes[local_10].i_file_size - iVar1;
    }
    __s = getAddressByLocation_File(inodes[id].i_blocks[0]);
    super_block.inode_bitmap[id] = false;
    super_block.block_bitmap[inodes[id].i_blocks[0]] = false;
    memset(__s,0,0x1000);
    memset(inodes + id,0,0x20);
  }
  else {
    __s_00 = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
    for (q_1._4_4_ = 2; q_1._4_4_ < 0x10; q_1._4_4_ = q_1._4_4_ + 1) {
      iVar1 = strcmp(__s_00->dirs[q_1._4_4_].name,"");
      if (iVar1 != 0) {
        delDirOrFile(__s_00->dirs[q_1._4_4_].inode_id,id);
      }
    }
    super_block.inode_bitmap[id] = false;
    super_block.block_bitmap[inodes[id].i_blocks[0]] = false;
    memset(__s_00,0,0x1000);
    memset(inodes + id,0,0x20);
  }
  return;
}

Assistant:

void delDirOrFile(int id, int parentid) {
    if (inodes[id].i_mode == A_FILE) {
        int size = inodes[id].i_file_size;
        inodes[parentid].i_file_size -= size;
        while(parentid != 0){
            parentid = getParentById(parentid);
            inodes[parentid].i_file_size -= size;
        }
        File_Block *p = getAddressByLocation_File(inodes[id].i_blocks[0]);
        inode *q = &inodes[id];
        super_block.inode_bitmap[id] = 0;
        super_block.block_bitmap[inodes[id].i_blocks[0]] = 0;
        memset(p, '\0', sizeof(File_Block));
        memset(q, '\0', sizeof(inode));
    }
    else {
        dir_block *p = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
        for (int i = 2; i < 16; i++) {
            if (strcmp(p->dirs[i].name, "") != 0) {
                delDirOrFile(p->dirs[i].inode_id, id);
            }
        }
        inode *q = &inodes[id];
        super_block.inode_bitmap[id] = 0;
        super_block.block_bitmap[inodes[id].i_blocks[0]] = 0;
        memset(p, '\0', sizeof(dir_block));
        memset(q, '\0', sizeof(inode));
    }
}